

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_date(void)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  undefined8 uVar11;
  void *pvVar12;
  char *pcVar13;
  Status myStatus;
  Status myStatus_12;
  char iv_3 [11];
  char iv_2 [11];
  char iv_1 [11];
  char v_2 [12];
  char r_1 [11];
  char v_1_canrep [11];
  char v_3 [18];
  char r_8 [12];
  char r_3 [12];
  char r_2 [12];
  char v_2_canrep [12];
  char v_1 [18];
  char c_1 [14];
  char r_c [17];
  char r_b [17];
  char r_a [17];
  char r_9 [17];
  char r_7 [17];
  char r_6 [17];
  char r_5 [17];
  char r_4 [17];
  char v_3_canrep [18];
  char c_2 [15];
  char c_c [19];
  char c_b [19];
  char c_a [19];
  char c_9 [19];
  char c_8 [19];
  char c_7 [19];
  char c_6 [19];
  char c_5 [19];
  char c_4 [19];
  char c_3 [19];
  StrX local_428;
  char *local_418;
  Status local_40c;
  char local_408 [16];
  char local_3f8 [16];
  char local_3e8 [16];
  char local_3d8 [12];
  uint local_3cc;
  char local_3c8 [16];
  char local_3b8 [16];
  char local_3a8 [32];
  char local_388 [16];
  char local_378 [16];
  char local_368 [16];
  char local_358 [16];
  char local_348 [32];
  char local_328 [16];
  char local_318 [32];
  char local_2f8 [32];
  char local_2d8 [32];
  char local_2b8 [32];
  char local_298 [32];
  char local_278 [32];
  char local_258 [32];
  char local_238 [32];
  char local_218 [32];
  char local_1f8 [16];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [32];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [32];
  char local_e8 [32];
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  builtin_strncpy(local_348,"   1991-05-31   \n",0x12);
  builtin_strncpy(local_3d8 + 8,"30Z",4);
  builtin_strncpy(local_3d8,"9999-06-",8);
  builtin_strncpy(local_3a8,"99991-07-31+14:00",0x12);
  builtin_strncpy(local_3e8,"2000-12-32",0xb);
  builtin_strncpy(local_3f8,"2001-02-29",0xb);
  builtin_strncpy(local_408,"2001-06-31",0xb);
  builtin_strncpy(local_3b8,"1991-05-31",0xb);
  builtin_strncpy(local_358 + 8,"30Z",4);
  builtin_strncpy(local_358,"9999-06-",8);
  builtin_strncpy(local_218,"99991-07-30-10:00",0x12);
  builtin_strncpy(local_328 + 8,"-31  ",6);
  builtin_strncpy(local_328," 1993-05",8);
  builtin_strncpy(local_3c8,"1993-05-31",0xb);
  builtin_strncpy(local_1f8," 1993-05-31Z  ",0xf);
  builtin_strncpy(local_368 + 8,"31Z",4);
  builtin_strncpy(local_368,"1993-05-",8);
  builtin_strncpy(local_c8," 1993-05-31+00:00 ",0x13);
  builtin_strncpy(local_378 + 8,"31Z",4);
  builtin_strncpy(local_378,"1993-05-",8);
  builtin_strncpy(local_e8," 1993-05-31+00:01 ",0x13);
  builtin_strncpy(local_238,"1993-05-31+00:01",0x11);
  builtin_strncpy(local_108," 1993-05-31+12:00 ",0x13);
  builtin_strncpy(local_258,"1993-05-31+12:00",0x11);
  builtin_strncpy(local_128," 1994-01-01+12:01 ",0x13);
  builtin_strncpy(local_278,"1993-12-31-11:59",0x11);
  builtin_strncpy(local_148," 1994-01-01+14:00 ",0x13);
  builtin_strncpy(local_298,"1993-12-31-10:00",0x11);
  builtin_strncpy(local_168," 1993-06-01-00:00 ",0x13);
  builtin_strncpy(local_388,"1993-06-01Z",0xc);
  builtin_strncpy(local_188," 1993-06-01-00:01 ",0x13);
  builtin_strncpy(local_2b8,"1993-06-01-00:01",0x11);
  builtin_strncpy(local_1a8," 1993-06-01-11:59 ",0x13);
  builtin_strncpy(local_2d8,"1993-06-01-11:59",0x11);
  builtin_strncpy(local_1c8," 1993-05-31-12:00 ",0x13);
  builtin_strncpy(local_2f8,"1993-06-01+12:00",0x11);
  builtin_strncpy(local_1e8," 1993-05-31-14:00 ",0x13);
  builtin_strncpy(local_318,"1993-06-01+10:00",0x11);
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xece,local_348,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xecf,local_3d8,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed0,local_3a8,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    if ((int)local_418 != 6) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      if (((ulong)local_418 & 0xffffffff) < 0xb) {
        pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
      }
      else {
        pcVar13 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed3,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
      goto LAB_00121933;
    }
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed3,local_3e8,local_428.fLocalForm,0);
LAB_00121933:
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    if ((int)local_418 != 6) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      if (((ulong)local_418 & 0xffffffff) < 0xb) {
        pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
      }
      else {
        pcVar13 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed4,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
      goto LAB_00121a39;
    }
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed4,local_3f8,local_428.fLocalForm,0);
LAB_00121a39:
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar2 == '\0') {
    if ((int)local_418 == 6) goto LAB_00121b42;
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    if (((ulong)local_418 & 0xffffffff) < 0xb) {
      pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
    }
    else {
      pcVar13 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xed5,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar13);
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed5,local_408,local_428.fLocalForm,0);
  }
  StrX::~StrX(&local_428);
  errSeen = 1;
LAB_00121b42:
  bVar9 = true;
  do {
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xeef,local_348);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_50 = 0x5000007c7;
      local_48 = 0x1f;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1f,CONCAT88(0x5000007c7,local_58))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar12);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef0,local_3d8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_78 = 0x60000270f;
      local_70 = 0x1e;
      uStack_6c = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x60000270f,local_80))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar12);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x8;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef1,local_3a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_a0 = 0x700018697;
      local_98 = 0x1e;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      bVar3 = compareActualValue(dt_date,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x700018697,local_a8))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar12);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef4,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar12 = (void *)0xef4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef4,local_3e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar12);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef5,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar12 = (void *)0xef5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef5,local_3f8);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar12);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef6,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar12 = (void *)0xef6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef6,local_408);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar12);
    }
    bVar3 = bVar9 != false;
    bVar9 = false;
  } while (bVar3);
  uVar11 = CONCAT71((int7)((ulong)local_408 >> 8),1);
  do {
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_3cc = (uint)uVar11;
    bVar9 = SUB81(uVar11,0);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf12,local_348);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_3b8;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122333:
          if (*pcVar13 == '\0') goto LAB_00122383;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122333;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf12,local_348,local_428.fLocalForm,local_418,local_3b8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122383:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf13,local_3d8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_358;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122474:
          if (*pcVar13 == '\0') goto LAB_001224c4;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122474;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf13,local_3d8,local_428.fLocalForm,local_418,local_358);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001224c4:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf14,local_3a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_218;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_001225b5:
          if (*pcVar13 == '\0') goto LAB_00122605;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001225b5;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf14,local_3a8,local_428.fLocalForm,local_418,local_218);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122605:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf16,local_328);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_3c8;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_001226f6:
          if (*pcVar13 == '\0') goto LAB_00122746;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001226f6;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf16,local_328,local_428.fLocalForm,local_418,local_3c8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122746:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf17,local_1f8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_368;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122837:
          if (*pcVar13 == '\0') goto LAB_00122887;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122837;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf17,local_1f8,local_428.fLocalForm,local_418,local_368);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122887:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf18,local_c8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_378;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122978:
          if (*pcVar13 == '\0') goto LAB_001229c8;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122978;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf18,local_c8,local_428.fLocalForm,local_418,local_378);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001229c8:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf19,local_e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_238;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122ab9:
          if (*pcVar13 == '\0') goto LAB_00122b09;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122ab9;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf19,local_e8,local_428.fLocalForm,local_418,local_238);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122b09:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1a,local_108);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_258;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122bfa:
          if (*pcVar13 == '\0') goto LAB_00122c4a;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122bfa;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1a,local_108,local_428.fLocalForm,local_418,local_258);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122c4a:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1b,local_128);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_278;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122d3b:
          if (*pcVar13 == '\0') goto LAB_00122d8b;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122d3b;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1b,local_128,local_428.fLocalForm,local_418,local_278);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122d8b:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1c,local_148);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_298;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122e7c:
          if (*pcVar13 == '\0') goto LAB_00122ecc;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122e7c;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1c,local_148,local_428.fLocalForm,local_418,local_298);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122ecc:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1d,local_168);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_388;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00122fbd:
          if (*pcVar13 == '\0') goto LAB_0012300d;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00122fbd;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1d,local_168,local_428.fLocalForm,local_418,local_388);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_0012300d:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1e,local_188);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_2b8;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_001230fe:
          if (*pcVar13 == '\0') goto LAB_0012314e;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001230fe;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1e,local_188,local_428.fLocalForm,local_418,local_2b8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_0012314e:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1f,local_1a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_2d8;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_0012323f:
          if (*pcVar13 == '\0') goto LAB_0012328f;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0012323f;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1f,local_1a8,local_428.fLocalForm,local_418,local_2d8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_0012328f:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf20,local_1c8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_2f8;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_00123380:
          if (*pcVar13 == '\0') goto LAB_001233d0;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00123380;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf20,local_1c8,local_428.fLocalForm,local_418,local_2f8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001233d0:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_40c = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_40c,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf21,local_1e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_418 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_318;
      if (local_418 != pcVar13) {
        pcVar7 = local_418;
        if (local_418 == (char *)0x0) {
LAB_001234c1:
          if (*pcVar13 == '\0') goto LAB_00123511;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001234c1;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf21,local_1e8,local_428.fLocalForm,local_418,local_318);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123511:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (lVar8 == 0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf24,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        goto LAB_0012362c;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf24,local_3e8);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012362c:
      errSeen = 1;
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (lVar8 == 0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf25,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        goto LAB_00123735;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf25,local_3f8);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00123735:
      errSeen = 1;
    }
    local_418 = (char *)((ulong)local_418 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_418,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    uVar10 = local_3cc;
    if (lVar8 == 0) {
      if ((int)local_418 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_418 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_418 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf26,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_428);
        goto LAB_00123843;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf26,local_408);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
      uVar10 = local_3cc;
LAB_00123843:
      errSeen = 1;
    }
    uVar11 = 0;
    if ((uVar10 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_date()
{
    const XSValue::DataType dt = XSValue::dt_date;
    bool  toValidate = true;

    const char v_1[]="   1991-05-31   \n";
    const char v_2[]="9999-06-30Z";
    const char v_3[]="99991-07-31+14:00";

    const char iv_1[]="2000-12-32";
    const char iv_2[]="2001-02-29";
    const char iv_3[]="2001-06-31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="1991-05-31";
    const char v_2_canrep[]="9999-06-30Z";
    const char v_3_canrep[]="99991-07-30-10:00";

    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */

    const char c_1[] = " 1993-05-31  ";       const char r_1[] = "1993-05-31";
    const char c_2[] = " 1993-05-31Z  ";      const char r_2[] = "1993-05-31Z";
    const char c_3[] = " 1993-05-31+00:00 ";  const char r_3[] = "1993-05-31Z";
    const char c_4[] = " 1993-05-31+00:01 ";  const char r_4[] = "1993-05-31+00:01";
    const char c_5[] = " 1993-05-31+12:00 ";  const char r_5[] = "1993-05-31+12:00";
    const char c_6[] = " 1994-01-01+12:01 ";  const char r_6[] = "1993-12-31-11:59";
    const char c_7[] = " 1994-01-01+14:00 ";  const char r_7[] = "1993-12-31-10:00";
    const char c_8[] = " 1993-06-01-00:00 ";  const char r_8[] = "1993-06-01Z";
    const char c_9[] = " 1993-06-01-00:01 ";  const char r_9[] = "1993-06-01-00:01";
    const char c_a[] = " 1993-06-01-11:59 ";  const char r_a[] = "1993-06-01-11:59";
    const char c_b[] = " 1993-05-31-12:00 ";  const char r_b[] = "1993-06-01+12:00";
    const char c_c[] = " 1993-05-31-14:00 ";  const char r_c[] = "1993-06-01+10:00";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 1991;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 05;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 9999;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 06;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 99991;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 07;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        CANREP_TEST(c_1,  dt, toValidate, EXP_RET_CANREP_TRUE, r_1, DONT_CARE);
        CANREP_TEST(c_2,  dt, toValidate, EXP_RET_CANREP_TRUE, r_2, DONT_CARE);
        CANREP_TEST(c_3,  dt, toValidate, EXP_RET_CANREP_TRUE, r_3, DONT_CARE);
        CANREP_TEST(c_4,  dt, toValidate, EXP_RET_CANREP_TRUE, r_4, DONT_CARE);
        CANREP_TEST(c_5,  dt, toValidate, EXP_RET_CANREP_TRUE, r_5, DONT_CARE);
        CANREP_TEST(c_6,  dt, toValidate, EXP_RET_CANREP_TRUE, r_6, DONT_CARE);
        CANREP_TEST(c_7,  dt, toValidate, EXP_RET_CANREP_TRUE, r_7, DONT_CARE);
        CANREP_TEST(c_8,  dt, toValidate, EXP_RET_CANREP_TRUE, r_8, DONT_CARE);
        CANREP_TEST(c_9,  dt, toValidate, EXP_RET_CANREP_TRUE, r_9, DONT_CARE);
        CANREP_TEST(c_a,  dt, toValidate, EXP_RET_CANREP_TRUE, r_a, DONT_CARE);
        CANREP_TEST(c_b,  dt, toValidate, EXP_RET_CANREP_TRUE, r_b, DONT_CARE);
        CANREP_TEST(c_c,  dt, toValidate, EXP_RET_CANREP_TRUE, r_c, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    }

}